

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O2

SUNErrCode SUNHashMap_Values(SUNHashMap map,void ***values,int64_t value_size)

{
  SUNHashMapKeyValue pSVar1;
  void **ppvVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if (map != (SUNHashMap)0x0) {
    ppvVar2 = (void **)malloc(value_size * map->buckets->capacity);
    *values = ppvVar2;
    iVar3 = 0;
    for (lVar4 = 0; lVar4 < map->buckets->capacity; lVar4 = lVar4 + 1) {
      pSVar1 = map->buckets->values[lVar4];
      if (pSVar1 != (SUNHashMapKeyValue)0x0) {
        lVar5 = (long)iVar3;
        iVar3 = iVar3 + 1;
        (*values)[lVar5] = pSVar1->value;
      }
    }
    return 0;
  }
  return -9999;
}

Assistant:

SUNDIALS_MAYBE_UNUSED
SUNErrCode SUNHashMap_Values(SUNHashMap map, void*** values, int64_t value_size)
{
  int count = 0;

  if (!map) { return SUN_ERR_ARG_CORRUPT; }

  *values = (void**)malloc(SUNHashMap_Capacity(map) * value_size);
  if (!values) { return SUN_ERR_MALLOC_FAIL; }

  /* Copy the values into a new array */
  for (int64_t i = 0; i < SUNHashMap_Capacity(map); i++)
  {
    SUNHashMapKeyValue kvp = *SUNStlVector_SUNHashMapKeyValue_At(map->buckets, i);
    if (kvp) { (*values)[count++] = kvp->value; }
  }

  return SUN_SUCCESS;
}